

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyimpl.cpp
# Opt level: O1

void __thiscall QNetworkReplyImplPrivate::createCache(QNetworkReplyImplPrivate *this)

{
  byte bVar1;
  QAbstractNetworkCache *pQVar2;
  long in_FS_OFFSET;
  bool bVar3;
  QVariant QStack_78;
  QVariant local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = 1;
  bVar3 = true;
  if ((QNetworkAccessBackend *)this->backend != (QNetworkAccessBackend *)0x0) {
    pQVar2 = QNetworkAccessBackend::networkCache((QNetworkAccessBackend *)this->backend);
    bVar3 = pQVar2 == (QAbstractNetworkCache *)0x0;
  }
  if (!bVar3) {
    QVariant::QVariant(&QStack_78,true);
    QNetworkRequest::attribute
              (&local_58,&(this->super_QNetworkReplyPrivate).request,CacheSaveControlAttribute,
               &QStack_78);
    bVar1 = QVariant::toBool();
    bVar1 = bVar1 ^ 1;
    QVariant::~QVariant(&local_58);
    QVariant::~QVariant(&QStack_78);
  }
  if (bVar1 == 0) {
    this->cacheEnabled = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QNetworkReplyImplPrivate::createCache()
{
    // check if we can save and if we're allowed to
    if (!networkCache()
        || !request.attribute(QNetworkRequest::CacheSaveControlAttribute, true).toBool())
        return;
    cacheEnabled = true;
}